

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_p.h
# Opt level: O0

uint8_t * chunkcopy_safe(uint8_t *out,uint8_t *from,uint64_t len,uint8_t *safe)

{
  ulong uVar1;
  long in_RCX;
  ulong in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint64_t non_olap_size;
  uint64_t tocopy;
  int32_t olap_dst;
  int32_t olap_src;
  uint64_t safelen;
  ulong local_60;
  bool local_52;
  bool local_51;
  size_t local_50;
  ulong local_40;
  size_t local_20;
  uint8_t *local_18;
  uint8_t *local_10;
  uint8_t *local_8;
  
  local_50 = in_RDX;
  if ((ulong)(in_RCX - (long)in_RDI) < in_RDX) {
    local_50 = in_RCX - (long)in_RDI;
  }
  local_20 = local_50;
  local_51 = in_RSI < in_RDI || in_RDI + local_50 <= in_RSI;
  local_52 = in_RDI < in_RSI || in_RSI + local_50 <= in_RDI;
  if ((local_51) && (local_52)) {
    memcpy(in_RDI,in_RSI,local_50);
    local_8 = in_RDI + local_50;
  }
  else if (in_RDI == in_RSI) {
    local_8 = in_RDI + local_50;
  }
  else {
    uVar1 = (long)in_RSI - (long)in_RDI;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((long)uVar1 < 1) {
      uVar1 = -uVar1;
    }
    while (local_20 != 0) {
      local_60 = uVar1;
      if (local_20 < uVar1) {
        local_60 = local_20;
      }
      local_20 = local_20 - local_60;
      for (local_40 = local_60; 0xf < local_40; local_40 = local_40 - 0x10) {
        *(undefined8 *)local_10 = *(undefined8 *)local_18;
        *(undefined8 *)(local_10 + 8) = *(undefined8 *)(local_18 + 8);
        local_10 = local_10 + 0x10;
        local_18 = local_18 + 0x10;
      }
      if (7 < local_40) {
        *(undefined8 *)local_10 = *(undefined8 *)local_18;
        local_10 = local_10 + 8;
        local_18 = local_18 + 8;
        local_40 = local_40 - 8;
      }
      if (3 < local_40) {
        *(undefined4 *)local_10 = *(undefined4 *)local_18;
        local_10 = local_10 + 4;
        local_18 = local_18 + 4;
        local_40 = local_40 - 4;
      }
      while (local_40 != 0) {
        *local_10 = *local_18;
        local_40 = local_40 - 1;
        local_18 = local_18 + 1;
        local_10 = local_10 + 1;
      }
    }
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

static inline uint8_t* chunkcopy_safe(uint8_t *out, uint8_t *from, uint64_t len, uint8_t *safe) {
    uint64_t safelen = safe - out;
    len = MIN(len, safelen);
    int32_t olap_src = from >= out && from < out + len;
    int32_t olap_dst = out >= from && out < from + len;
    uint64_t tocopy;

    /* For all cases without overlap, memcpy is ideal */
    if (!(olap_src || olap_dst)) {
        memcpy(out, from, (size_t)len);
        return out + len;
    }

    /* Complete overlap: Source == destination */
    if (out == from) {
        return out + len;
    }

    /* We are emulating a self-modifying copy loop here. To do this in a way that doesn't produce undefined behavior,
     * we have to get a bit clever. First if the overlap is such that src falls between dst and dst+len, we can do the
     * initial bulk memcpy of the nonoverlapping region. Then, we can leverage the size of this to determine the safest
     * atomic memcpy size we can pick such that we have non-overlapping regions. This effectively becomes a safe look
     * behind or lookahead distance. */
    uint64_t non_olap_size = llabs(from - out); // llabs vs labs for compatibility with windows

    /* So this doesn't give use a worst case scenario of function calls in a loop,
     * we want to instead break this down into copy blocks of fixed lengths
     *
     * TODO: The memcpy calls aren't inlined on architectures with strict memory alignment
     */
    while (len) {
        tocopy = MIN(non_olap_size, len);
        len -= tocopy;

        while (tocopy >= 16) {
            memcpy(out, from, 16);
            out += 16;
            from += 16;
            tocopy -= 16;
        }

        if (tocopy >= 8) {
            memcpy(out, from, 8);
            out += 8;
            from += 8;
            tocopy -= 8;
        }

        if (tocopy >= 4) {
            memcpy(out, from, 4);
            out += 4;
            from += 4;
            tocopy -= 4;
        }

        while (tocopy--) {
            *out++ = *from++;
        }
    }

    return out;
}